

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewtParser.c
# Opt level: O1

nps_node_t NPSGenNode2(uint32_t code,nps_node_t op1,nps_node_t op2)

{
  void *pvVar1;
  _Bool _Var2;
  ulong uVar3;
  nps_node_t nVar4;
  
  _Var2 = NewtStackExpand(&nps_stree,nps_stree.sp + 1);
  pvVar1 = nps_stree.stackp;
  if (_Var2) {
    uVar3 = (ulong)nps_stree.sp;
    *(uint32_t *)((long)nps_stree.stackp + uVar3 * 0x18) = code;
    *(nps_node_t *)((long)pvVar1 + uVar3 * 0x18 + 8) = op1;
    *(nps_node_t *)((long)pvVar1 + uVar3 * 0x18 + 0x10) = op2;
    nVar4 = (nps_node_t)(nps_stree.sp << 4 | 0xe);
    nps_stree.sp = nps_stree.sp + 1;
  }
  else {
    yyerror("Syntax tree overflow");
    nVar4 = 0xffffffffffffffff;
  }
  return nVar4;
}

Assistant:

nps_node_t NPSGenNode2(uint32_t code, nps_node_t op1, nps_node_t op2)
{
    nps_syntax_node_t *	node;
    
    if (! NewtStackExpand(&nps_stree, CX + 1))
    {
        yyerror("Syntax tree overflow");
        return -1;
    }
    
    node = &STREESTACK[CX];
    
    node->code = code;
    node->op1 = op1;
    node->op2 = op2;
    
    CX++;
    
    return NPSMakeSyntaxNode(CX - 1);
}